

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O2

void check_duplex<float>(float *input_buffer,float *output_buffer,long frame_count,
                        int input_channel_count)

{
  int line;
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  float fVar6;
  AssertionResult gtest_ar;
  AssertHelper local_50;
  String local_48;
  AssertHelper local_38;
  long frame_count_local;
  
  local_48.c_str_._0_4_ = 0x100;
  frame_count_local = frame_count;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&gtest_ar,"frame_count","256",&frame_count_local,(int *)&local_48);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,0x2ad,pcVar4);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    gtest_ar.success_ = output_buffer != (float *)0x0;
    if (output_buffer == (float *)0x0) {
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_48,&gtest_ar,"!!output_buffer","false","true");
      pcVar4 = (char *)CONCAT44(local_48.c_str_._4_4_,local_48.c_str_._0_4_);
      line = 0x2af;
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar.success_ = input_buffer != (float *)0x0;
      if (gtest_ar.success_) {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        uVar1 = 0;
        if (frame_count_local < 1) {
          frame_count_local = uVar1;
        }
        lVar2 = 1;
        do {
          bVar5 = frame_count_local == 0;
          frame_count_local = frame_count_local - 1;
          if (bVar5) {
            return;
          }
          if (input_channel_count == 2) {
            output_buffer[uVar1] = input_buffer[lVar2 + -1];
            fVar6 = input_buffer[lVar2];
            uVar3 = uVar1 | 1;
LAB_0010be08:
            output_buffer[uVar3] = fVar6;
          }
          else if (input_channel_count == 1) {
            fVar6 = *(float *)((long)input_buffer + uVar1 * 2);
            output_buffer[uVar1 + 1] = fVar6;
            uVar3 = uVar1;
            goto LAB_0010be08;
          }
          uVar1 = uVar1 + 2;
          lVar2 = lVar2 + input_channel_count;
        } while( true );
      }
      testing::Message::Message((Message *)&local_50);
      testing::internal::GetBoolAssertionFailureMessage
                ((internal *)&local_48,&gtest_ar,"!!input_buffer","false","true");
      pcVar4 = (char *)CONCAT44(local_48.c_str_._4_4_,local_48.c_str_._0_4_);
      line = 0x2b0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
               ,line,pcVar4);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::String::~String(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void check_duplex(const T * input_buffer,
                  T * output_buffer, long frame_count,
                  int input_channel_count)
{
  ASSERT_EQ(frame_count, 256);
  // Silence scan-build warning.
  ASSERT_TRUE(!!output_buffer); assert(output_buffer);
  ASSERT_TRUE(!!input_buffer); assert(input_buffer);

  int output_index = 0;
  int input_index = 0;
  for (int i = 0; i < frame_count; i++) {
    // output is two channels, input one or two channels.
    if (input_channel_count == 1) {
      output_buffer[output_index] = output_buffer[output_index + 1] = input_buffer[i];
    } else if (input_channel_count == 2) {
      output_buffer[output_index] = input_buffer[input_index];
      output_buffer[output_index + 1] = input_buffer[input_index + 1];
    }
    output_index += 2;
    input_index += input_channel_count;
  }
}